

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

bool __thiscall
QUrlPrivate::validateComponent
          (QUrlPrivate *this,Section section,QString *input,qsizetype begin,qsizetype end)

{
  char16_t *pcVar1;
  char16_t cVar2;
  uint uVar3;
  void *pvVar4;
  ErrorCode errorCode;
  size_t i;
  ulong supplement;
  size_t j;
  char16_t *pcVar5;
  
  pcVar5 = (input->d).ptr;
  supplement = begin;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = L"";
  }
  for (; supplement < (ulong)end; supplement = supplement + 1) {
    cVar2 = pcVar5[supplement];
    if (0x7f < (ushort)cVar2) goto LAB_0023ee61;
    if (cVar2 == L'%') {
      if (((supplement + 2 <= (ulong)end) &&
          ((uVar3 = (int)(char)pcVar5[supplement + 1] | 0x20, (byte)((char)uVar3 + 0x9fU) < 6 ||
           (uVar3 - 0x30 < 10)))) &&
         ((uVar3 = (int)(char)pcVar5[supplement + 2] | 0x20, (byte)((char)uVar3 + 0x9fU) < 6 ||
          (uVar3 - 0x30 < 10)))) goto LAB_0023ee0e;
LAB_0023ee69:
      if (section == UserInfo) goto LAB_0023ee79;
LAB_0023ee91:
      errorCode = (uint)section << 8;
      goto LAB_0023eea9;
    }
    if ((ushort)cVar2 < 0x21) goto LAB_0023ee69;
LAB_0023ee0e:
    pvVar4 = memchr("\"<>\\^`{|}\x7f",(uint)(ushort)cVar2,0xb);
    if (pvVar4 != (void *)0x0) goto LAB_0023ee69;
    if ((section & UserInfo) != ~FullUrl) {
      if (section != UserInfo) {
        pvVar4 = memchr(":/?#[]@",(uint)(ushort)cVar2,8);
        if (pvVar4 == (void *)0x0) goto LAB_0023ee61;
        goto LAB_0023ee91;
      }
      pvVar4 = memchr("/?#[]@",(uint)(ushort)cVar2,7);
      if (pvVar4 == (void *)0x0) goto LAB_0023ee61;
      goto LAB_0023ee79;
    }
LAB_0023ee61:
  }
  goto LAB_0023eeb1;
  while (pcVar1 = pcVar5 + begin, begin = begin + 1, *pcVar1 != L':') {
LAB_0023ee79:
    if (supplement <= (ulong)begin) {
      errorCode = InvalidUserNameError;
      goto LAB_0023eea9;
    }
  }
  errorCode = InvalidPasswordError;
LAB_0023eea9:
  setError(this,errorCode,input,supplement);
LAB_0023eeb1:
  return (ulong)end <= supplement;
}

Assistant:

bool QUrlPrivate::validateComponent(QUrlPrivate::Section section, const QString &input,
                                    qsizetype begin, qsizetype end)
{
    // What we need to look out for, that the regular parser tolerates:
    //  - percent signs not followed by two hex digits
    //  - forbidden characters, which should always appear encoded
    //    '"' / '<' / '>' / '\' / '^' / '`' / '{' / '|' / '}' / BKSP
    //    control characters
    //  - delimiters not allowed in certain positions
    //    . scheme: parser is already strict
    //    . user info: gen-delims except ":" disallowed ("/" / "?" / "#" / "[" / "]" / "@")
    //    . host: parser is stricter than the standard
    //    . port: parser is stricter than the standard
    //    . path: all delimiters allowed
    //    . fragment: all delimiters allowed
    //    . query: all delimiters allowed
    static const char forbidden[] = "\"<>\\^`{|}\x7F";
    static const char forbiddenUserInfo[] = ":/?#[]@";

    Q_ASSERT(section != Authority && section != Hierarchy && section != FullUrl);

    const ushort *const data = reinterpret_cast<const ushort *>(input.constData());
    for (size_t i = size_t(begin); i < size_t(end); ++i) {
        uint uc = data[i];
        if (uc >= 0x80)
            continue;

        bool error = false;
        if ((uc == '%' && (size_t(end) < i + 2 || !isHex(data[i + 1]) || !isHex(data[i + 2])))
                || uc <= 0x20 || strchr(forbidden, uc)) {
            // found an error
            error = true;
        } else if (section & UserInfo) {
            if (section == UserInfo && strchr(forbiddenUserInfo + 1, uc))
                error = true;
            else if (section != UserInfo && strchr(forbiddenUserInfo, uc))
                error = true;
        }

        if (!error)
            continue;

        ErrorCode errorCode = ErrorCode(int(section) << 8);
        if (section == UserInfo) {
            // is it the user name or the password?
            errorCode = InvalidUserNameError;
            for (size_t j = size_t(begin); j < i; ++j)
                if (data[j] == ':') {
                    errorCode = InvalidPasswordError;
                    break;
                }
        }

        setError(errorCode, input, i);
        return false;
    }

    // no errors
    return true;
}